

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void al_color_lab_to_rgb(float l,float a,float b,float *red,float *green,float *blue)

{
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  undefined4 in_XMM2_Da;
  float unaff_retaddr;
  float z;
  float y;
  float x;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  
  cielab_f_inv((double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  cielab_f_inv((double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  cielab_f_inv((double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  al_color_xyz_to_rgb(z,unaff_retaddr,in_XMM0_Da,
                      (float *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffff0),in_RDI,in_RSI);
  return;
}

Assistant:

void al_color_lab_to_rgb(float l, float a, float b,
    float *red, float *green, float *blue)
{
   float x = Xn * cielab_f_inv((l + 0.16) / 1.16 + a / 5.00);
   float y = Yn * cielab_f_inv((l + 0.16) / 1.16);
   float z = Zn * cielab_f_inv((l + 0.16) / 1.16 - b / 2.00);
   al_color_xyz_to_rgb(x, y, z, red, green, blue);
}